

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O3

EStatusCode __thiscall
PDFWriter::SetupStateFromModifiedStream
          (PDFWriter *this,IByteReaderWithPosition *inModifiedSourceStream,EPDFVersion inPDFVersion,
          PDFCreationSettings *inPDFCreationSettings)

{
  PDFParser *this_00;
  DocumentContext *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  EStatusCode EVar3;
  EPDFVersion EVar4;
  PDFParsingOptions parsingOptions;
  PDFParsingOptions local_50;
  
  EVar4 = inPDFCreationSettings->WriteXrefAsXrefStream | ePDFVersion14;
  if (inPDFVersion != ePDFVersionUndefined) {
    EVar4 = inPDFVersion;
  }
  paVar1 = &local_50.Password.field_2;
  local_50.Password._M_string_length = 0;
  local_50.Password.field_2._M_local_buf[0] = '\0';
  local_50.Password._M_dataplus._M_p = (pointer)paVar1;
  if ((inPDFCreationSettings->DocumentEncryptionOptions).ShouldEncrypt == true) {
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  this_00 = &this->mModifiedFileParser;
  EVar3 = PDFParser::StartPDFParsing(this_00,inModifiedSourceStream,&local_50);
  if (EVar3 == eSuccess) {
    ObjectsContext::SetupModifiedFile(&this->mObjectsContext,this_00);
    this_01 = &this->mDocumentContext;
    EVar3 = PDFHummus::DocumentContext::SetupModifiedFile(this_01,this_00);
    if (EVar3 == eSuccess) {
      bVar2 = PDFParser::IsEncrypted(this_00);
      if (bVar2) {
        bVar2 = PDFParser::IsEncryptionSupported(this_00);
        if (bVar2) {
          PDFHummus::DocumentContext::SetupEncryption(this_01,this_00);
          bVar2 = PDFHummus::DocumentContext::SupportsEncryption(this_01);
          EVar3 = eFailure;
          if (!bVar2) goto LAB_001dd9ad;
        }
      }
      this->mModifiedFileVersion = EVar4;
      EVar3 = eSuccess;
    }
  }
LAB_001dd9ad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Password._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.Password._M_dataplus._M_p,
                    CONCAT71(local_50.Password.field_2._M_allocated_capacity._1_7_,
                             local_50.Password.field_2._M_local_buf[0]) + 1);
  }
  return EVar3;
}

Assistant:

EStatusCode PDFWriter::SetupStateFromModifiedStream(IByteReaderWithPosition* inModifiedSourceStream,
                                                    EPDFVersion inPDFVersion,
													const PDFCreationSettings& inPDFCreationSettings)
{
	EPDFVersion pdfVersion = thisOrDefaultVersion(inPDFVersion, inPDFCreationSettings.WriteXrefAsXrefStream);
    EStatusCode status;
	PDFParsingOptions parsingOptions;

	// this bit here is actually interesting. in order to modify an already encrypted document
	// and add more content to it, i just need the user password. not the owner one.
	// in fact, passing the owner password here will create the wrong encryption key.
	// interesting.
	if (inPDFCreationSettings.DocumentEncryptionOptions.ShouldEncrypt)
		parsingOptions.Password = inPDFCreationSettings.DocumentEncryptionOptions.UserPassword;

    do
    {
        status = mModifiedFileParser.StartPDFParsing(inModifiedSourceStream, parsingOptions);
        if(status != eSuccess)
            break;

        mObjectsContext.SetupModifiedFile(&mModifiedFileParser);

        status = mDocumentContext.SetupModifiedFile(&mModifiedFileParser);
        if(status != eSuccess)
            break;

		if (mModifiedFileParser.IsEncrypted() && mModifiedFileParser.IsEncryptionSupported()) {
			mDocumentContext.SetupEncryption(&mModifiedFileParser);
			if (!mDocumentContext.SupportsEncryption()) {
				status = eFailure;
				break;
			}
		}

        mModifiedFileVersion = pdfVersion;
    }
    while (false);

    return status;
}